

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::SetCachedSize(Message *this,int param_2)

{
  Descriptor *this_00;
  LogMessage *this_01;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  LogMessage *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff80,(LogLevel_conflict)((ulong)in_stack_ffffffffffffff78 >> 0x20)
             ,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  internal::LogMessage::operator<<
            (in_stack_ffffffffffffff70,
             (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this_00 = GetDescriptor((Message *)in_stack_ffffffffffffff70);
  Descriptor::full_name_abi_cxx11_(this_00);
  internal::LogMessage::operator<<
            (in_stack_ffffffffffffff70,
             (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  this_01 = internal::LogMessage::operator<<
                      (in_stack_ffffffffffffff70,
                       (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  internal::LogFinisher::operator=
            ((LogFinisher *)this_01,
             (LogMessage *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  internal::LogMessage::~LogMessage((LogMessage *)0x4497d6);
  return;
}

Assistant:

void Message::SetCachedSize(int /* size */) const {
  GOOGLE_LOG(FATAL) << "Message class \"" << GetDescriptor()->full_name()
             << "\" implements neither SetCachedSize() nor ByteSize().  "
                "Must implement one or the other.";
}